

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O1

void test_cio_write_buffer_queue_tail(void)

{
  long ***ppplVar1;
  long ***ppplVar2;
  long ****pppplVar3;
  cio_write_buffer wbh;
  uint data1;
  char data2 [13];
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  long ***local_90;
  long ***local_88;
  long local_80;
  UNITY_INT UStack_78;
  undefined4 local_6c;
  undefined5 local_68;
  undefined3 uStack_63;
  undefined5 uStack_60;
  long ***local_58;
  long ***local_50;
  undefined5 *local_48;
  long local_40;
  long ***local_38;
  long ***local_30;
  undefined4 *local_28;
  long local_20;
  
  local_80 = 0;
  UStack_78 = 0;
  local_90 = (long ***)&local_90;
  local_88 = (long ***)&local_90;
  UnityAssertEqualNumber
            (0,0,
             "Number of elements in write buffer not \'0\' after initialization of write buffer head!"
             ,0x4c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,UStack_78,"Write buffer total length not correct!",0x4d,UNITY_DISPLAY_STYLE_INT);
  local_28 = &local_6c;
  local_6c = 0x12;
  local_20 = 4;
  local_30 = local_88;
  local_38 = (long ***)&local_90;
  *local_88 = (long **)&local_38;
  local_80 = local_80 + 1;
  UStack_78 = UStack_78 + local_20;
  local_88 = (long ***)&local_38;
  UnityAssertEqualNumber
            (1,local_80,
             "Number of elements in write buffer not \'1\' after inserting first element!",0x54,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,UStack_78,"Write buffer total length not correct!",0x55,UNITY_DISPLAY_STYLE_INT);
  local_48 = &local_68;
  uStack_60 = 0x21646c72;
  local_68 = 0x6f6c6c6548;
  uStack_63 = 0x6f5720;
  local_40 = 0xd;
  local_50 = local_88;
  local_58 = (long ***)&local_90;
  *local_88 = (long **)&local_58;
  local_80 = local_80 + 1;
  UStack_78 = UStack_78 + local_40;
  local_88 = (long ***)&local_58;
  UnityAssertEqualNumber
            (2,local_80,
             "Number of elements in write buffer not \'2\' after inserting second element!",0x5c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,UStack_78,"Write buffer total length not correct!",0x5d,UNITY_DISPLAY_STYLE_INT);
  pppplVar3 = (long ****)local_90;
  if ((long ****)local_90 == &local_90) {
    pppplVar3 = (long ****)0x0;
  }
  if (pppplVar3 != (long ****)0x0) {
    local_80 = local_80 + -1;
    UStack_78 = UStack_78 - (long)pppplVar3[3];
    ppplVar1 = *pppplVar3;
    ppplVar2 = pppplVar3[1];
    ppplVar1[1] = (long **)ppplVar2;
    *ppplVar2 = (long **)ppplVar1;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_38,(UNITY_INT)pppplVar3,
             "First dequeued write buffer is not the write buffer inserted first!",0x60,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,local_80,
             "Number of elements in write buffer not \'1\' after dequeueing first element!",0x62,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0xd,UStack_78,"Write buffer total length not correct!",99,UNITY_DISPLAY_STYLE_INT);
  pppplVar3 = (long ****)0x0;
  if ((long ****)local_90 != &local_90) {
    pppplVar3 = (long ****)local_90;
  }
  if (pppplVar3 != (long ****)0x0) {
    local_80 = local_80 + -1;
    UStack_78 = UStack_78 - (long)pppplVar3[3];
    ppplVar1 = *pppplVar3;
    ppplVar2 = pppplVar3[1];
    ppplVar1[1] = (long **)ppplVar2;
    *ppplVar2 = (long **)ppplVar1;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_58,(UNITY_INT)pppplVar3,
             "First dequeued write buffer is not the write buffer inserted secondly!",0x66,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,local_80,
             "Number of elements in write buffer not \'0\' after dequeueing second element!",0x68,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,UStack_78,"Write buffer total length not correct!",0x69,UNITY_DISPLAY_STYLE_INT);
  pppplVar3 = (long ****)local_90;
  if ((long ****)local_90 == &local_90) {
    pppplVar3 = (long ****)0x0;
  }
  if (pppplVar3 != (long ****)0x0) {
    local_80 = local_80 + -1;
    UStack_78 = UStack_78 - (long)pppplVar3[3];
    ppplVar1 = *pppplVar3;
    ppplVar2 = pppplVar3[1];
    ppplVar1[1] = (long **)ppplVar2;
    *ppplVar2 = (long **)ppplVar1;
  }
  UnityAssertEqualNumber
            (0,(UNITY_INT)pppplVar3,
             "Return value of cio_write_buffer_queue_dequeue not NULL when called on an empty write buffer!"
             ,0x6c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,local_80,
             "Number of elements in write buffer not \'0\' after dequeueing from an empty write buffer!"
             ,0x6e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_queue_tail(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after initialization of write buffer head!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1;
	cio_write_buffer_element_init(&wb1, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh, &wb1);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, num_elements, "Number of elements in write buffer not '1' after inserting first element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh, &wb2);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	struct cio_write_buffer *dequeued_wb = cio_write_buffer_queue_dequeue(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1, dequeued_wb, "First dequeued write buffer is not the write buffer inserted first!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, num_elements, "Number of elements in write buffer not '1' after dequeueing first element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2, dequeued_wb, "First dequeued write buffer is not the write buffer inserted secondly!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after dequeueing second element!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(NULL, dequeued_wb, "Return value of cio_write_buffer_queue_dequeue not NULL when called on an empty write buffer!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after dequeueing from an empty write buffer!");
}